

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

void __thiscall CReg::CReg(CReg *this,UChar *_iso,char *_id)

{
  size_t sVar1;
  int iVar2;
  
  this->next = (CReg *)0x0;
  sVar1 = strlen(_id);
  iVar2 = 0x9c;
  if ((int)sVar1 < 0x9c) {
    iVar2 = (int)sVar1;
  }
  strncpy(this->id,_id,(long)iVar2);
  this->id[iVar2] = '\0';
  u_memcpy_63(this->iso,_iso,3);
  this->iso[3] = L'\0';
  return;
}

Assistant:

CReg(const UChar* _iso, const char* _id)
        : next(0)
    {
        int32_t len = (int32_t)uprv_strlen(_id);
        if (len > (int32_t)(sizeof(id)-1)) {
            len = (sizeof(id)-1);
        }
        uprv_strncpy(id, _id, len);
        id[len] = 0;
        u_memcpy(iso, _iso, ISO_CURRENCY_CODE_LENGTH);
        iso[ISO_CURRENCY_CODE_LENGTH] = 0;
    }